

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

void __thiscall
flatbuffers::python::PythonGenerator::GenStructForObjectAPI
          (PythonGenerator *this,StructDef *struct_def,string *code_ptr)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Self __tmp;
  string code;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  import_list;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> im;
  string local_c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if ((struct_def->super_Definition).generated == false) {
    p_Var1 = &local_a0._M_impl.super__Rb_tree_header;
    local_a0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_a0._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    local_c0._M_string_length = 0;
    local_c0.field_2._M_local_buf[0] = '\0';
    local_a0._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    local_a0._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    BeginClassForObjectAPI(this,struct_def,&local_c0);
    GenInitialize(this,struct_def,&local_c0,
                  (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_a0);
    InitializeFromBuf(this,struct_def,&local_c0);
    InitializeFromPackedBuf(this,struct_def,&local_c0);
    InitializeFromObjForObject(this,struct_def,&local_c0);
    if ((((this->super_BaseGenerator).parser_)->opts).gen_compare == true) {
      GenCompareOperator(this,struct_def,&local_c0);
    }
    GenUnPack(this,struct_def,&local_c0);
    if (struct_def->fixed == true) {
      GenPackForStruct(this,struct_def,&local_c0);
    }
    else {
      GenPackForTable(this,struct_def,&local_c0);
    }
    std::__cxx11::string::append((char *)code_ptr);
    for (p_Var2 = local_a0._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != p_Var1; p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      std::__cxx11::string::string((string *)&local_50,(string *)(p_Var2 + 1));
      std::operator+(&local_70,&local_50,"\n");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&local_c0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_a0);
  }
  return;
}

Assistant:

void GenStructForObjectAPI(const StructDef &struct_def,
                             std::string *code_ptr) const {
    if (struct_def.generated) return;

    std::set<std::string> import_list;
    std::string code;

    // Creates an object class for a struct or a table
    BeginClassForObjectAPI(struct_def, &code);

    GenInitialize(struct_def, &code, &import_list);

    InitializeFromBuf(struct_def, &code);

    InitializeFromPackedBuf(struct_def, &code);

    InitializeFromObjForObject(struct_def, &code);

    if (parser_.opts.gen_compare) { GenCompareOperator(struct_def, &code); }

    GenUnPack(struct_def, &code);

    if (struct_def.fixed) {
      GenPackForStruct(struct_def, &code);
    } else {
      GenPackForTable(struct_def, &code);
    }

    // Adds the imports at top.
    auto &code_base = *code_ptr;
    code_base += "\n";
    for (auto it = import_list.begin(); it != import_list.end(); it++) {
      auto im = *it;
      code_base += im + "\n";
    }
    code_base += code;
  }